

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::IncludeScope::IncludeScope
          (IncludeScope *this,cmMakefile *mf,string *filenametoread,bool noPolicyScope)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  cmState *this_00;
  PolicyMap local_a0;
  PolicyMap local_78;
  cmStateSnapshot local_50;
  cmListFileBacktrace local_38;
  undefined1 local_21;
  string *psStack_20;
  bool noPolicyScope_local;
  string *filenametoread_local;
  cmMakefile *mf_local;
  IncludeScope *this_local;
  
  this->Makefile = mf;
  this->NoPolicyScope = noPolicyScope;
  this->CheckCMP0011 = false;
  this->ReportError = true;
  local_21 = noPolicyScope;
  psStack_20 = filenametoread;
  filenametoread_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  cmListFileBacktrace::Push(&local_38,(string *)&this->Makefile->Backtrace);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,&local_38);
  cmListFileBacktrace::~cmListFileBacktrace(&local_38);
  PushFunctionBlockerBarrier(this->Makefile);
  this_00 = GetState(this->Makefile);
  cmState::CreateIncludeFileSnapshot(&local_50,this_00,&this->Makefile->StateSnapshot,psStack_20);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).State = local_50.State;
  (pcVar1->StateSnapshot).Position.Tree = local_50.Position.Tree;
  (pcVar1->StateSnapshot).Position.Position = local_50.Position.Position;
  if ((this->NoPolicyScope & 1U) == 0) {
    PVar2 = GetPolicyStatus(this->Makefile,CMP0011,false);
    switch(PVar2) {
    case OLD:
      this->NoPolicyScope = true;
      break;
    case WARN:
      pcVar1 = this->Makefile;
      memset(&local_78,0,0x28);
      cmPolicies::PolicyMap::PolicyMap(&local_78);
      PushPolicy(pcVar1,true,&local_78);
      this->CheckCMP0011 = true;
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      this->CheckCMP0011 = true;
    case NEW:
      pcVar1 = this->Makefile;
      memset(&local_a0,0,0x28);
      cmPolicies::PolicyMap::PolicyMap(&local_a0);
      PushPolicy(pcVar1,false,&local_a0);
    }
  }
  return;
}

Assistant:

cmMakefile::IncludeScope::IncludeScope(cmMakefile* mf,
                                       std::string const& filenametoread,
                                       bool noPolicyScope)
  : Makefile(mf)
  , NoPolicyScope(noPolicyScope)
  , CheckCMP0011(false)
  , ReportError(true)
{
  this->Makefile->Backtrace = this->Makefile->Backtrace.Push(filenametoread);

  this->Makefile->PushFunctionBlockerBarrier();

  this->Makefile->StateSnapshot =
    this->Makefile->GetState()->CreateIncludeFileSnapshot(
      this->Makefile->StateSnapshot, filenametoread);
  if (!this->NoPolicyScope) {
    // Check CMP0011 to determine the policy scope type.
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0011)) {
      case cmPolicies::WARN:
        // We need to push a scope to detect whether the script sets
        // any policies that would affect the includer and therefore
        // requires a warning.  We use a weak scope to simulate OLD
        // behavior by allowing policy changes to affect the includer.
        this->Makefile->PushPolicy(true);
        this->CheckCMP0011 = true;
        break;
      case cmPolicies::OLD:
        // OLD behavior is to not push a scope at all.
        this->NoPolicyScope = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        // We should never make this policy required, but we handle it
        // here just in case.
        this->CheckCMP0011 = true;
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to push a (strong) scope.
        this->Makefile->PushPolicy();
        break;
    }
  }
}